

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O3

void V_SetRndCmp(Vector *V)

{
  ulong uVar1;
  Real *pRVar2;
  LASErrIdType LVar3;
  int iVar4;
  ulong uVar5;
  
  LVar3 = LASResult();
  if (LVar3 == LASOK) {
    LVar3 = LASResult();
    if ((LVar3 == LASOK) && (uVar1 = V->Dim, uVar1 != 0)) {
      pRVar2 = V->Cmp;
      uVar5 = 1;
      do {
        iVar4 = rand();
        pRVar2[uVar5] = (double)iVar4 * 4.656612873077393e-10;
        uVar5 = uVar5 + 1;
      } while (uVar5 <= uVar1);
    }
    V->Multipl = 1.0;
  }
  return;
}

Assistant:

void V_SetRndCmp(Vector *V)
/* set random components of the vector V */
{
    size_t Dim, Ind;
    Real *VCmp;

    if (LASResult() == LASOK) {
        Dim = V_GetDim(V);
        VCmp = V->Cmp;
        for (Ind = 1; Ind <= Dim; Ind++) {
            VCmp[Ind] = (double)rand() / ((double)RAND_MAX + 1.0);
        }
        V->Multipl = 1.0;
    }
}